

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O1

void __thiscall llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(SmallPtrSetIteratorImpl *this)

{
  void **ppvVar1;
  
  if (this->Bucket <= this->End) {
    ppvVar1 = this->Bucket;
    while ((ppvVar1 != this->End && ((void *)0xfffffffffffffffd < *ppvVar1))) {
      ppvVar1 = ppvVar1 + 1;
      this->Bucket = ppvVar1;
    }
    return;
  }
  __assert_fail("Bucket <= End",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                ,0xf9,"void llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid()");
}

Assistant:

void AdvanceIfNotValid() {
    assert(Bucket <= End);
    while (Bucket != End &&
           (*Bucket == SmallPtrSetImplBase::getEmptyMarker() ||
            *Bucket == SmallPtrSetImplBase::getTombstoneMarker()))
      ++Bucket;
  }